

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O1

void gdImageSharpen(gdImagePtr im,int pct)

{
  int iVar1;
  int iVar2;
  float outer_coeff;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float inner_coeff;
  
  if ((0 < pct) && (im->trueColor != 0)) {
    iVar1 = im->sx;
    outer_coeff = (float)-pct / 400.0;
    iVar2 = im->sy;
    inner_coeff = 1.0 - (outer_coeff + outer_coeff);
    if (0 < iVar1) {
      iVar6 = 0;
      do {
        iVar3 = gdImageGetPixel(im,iVar6,0);
        if (iVar2 < 2) {
          iVar7 = 0;
        }
        else {
          iVar5 = iVar3;
          iVar4 = 1;
          do {
            iVar7 = iVar4;
            iVar3 = gdImageGetPixel(im,iVar6,iVar7 + -1);
            iVar4 = gdImageGetTrueColorPixel(im,iVar6,iVar7);
            iVar5 = gdImageSubSharpen(iVar5,iVar3,iVar4,inner_coeff,outer_coeff);
            gdImageSetPixel(im,iVar6,iVar7 + -1,iVar5);
            iVar5 = iVar3;
            iVar4 = iVar7 + 1;
          } while (iVar2 != iVar7 + 1);
        }
        iVar5 = gdImageGetPixel(im,iVar6,iVar7);
        iVar3 = gdImageSubSharpen(iVar3,iVar5,iVar5,inner_coeff,outer_coeff);
        gdImageSetPixel(im,iVar6,iVar7,iVar3);
        iVar6 = iVar6 + 1;
      } while (iVar6 != iVar1);
    }
    if (0 < iVar2) {
      iVar6 = 0;
      do {
        iVar3 = gdImageGetPixel(im,0,iVar6);
        if (iVar1 < 2) {
          iVar7 = 0;
        }
        else {
          iVar5 = iVar3;
          iVar4 = 1;
          do {
            iVar7 = iVar4;
            iVar3 = gdImageGetPixel(im,iVar7 + -1,iVar6);
            iVar4 = gdImageGetTrueColorPixel(im,iVar7,iVar6);
            iVar5 = gdImageSubSharpen(iVar5,iVar3,iVar4,inner_coeff,outer_coeff);
            gdImageSetPixel(im,iVar7 + -1,iVar6,iVar5);
            iVar5 = iVar3;
            iVar4 = iVar7 + 1;
          } while (iVar1 != iVar7 + 1);
        }
        iVar5 = gdImageGetPixel(im,iVar7,iVar6);
        iVar3 = gdImageSubSharpen(iVar3,iVar5,iVar5,inner_coeff,outer_coeff);
        gdImageSetPixel(im,iVar7,iVar6,iVar3);
        iVar6 = iVar6 + 1;
      } while (iVar6 != iVar2);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void)
gdImageSharpen (gdImagePtr im, int pct)
{
	int x, y;
	int sx, sy;
	float inner_coeff, outer_coeff;

	sx = im->sx;
	sy = im->sy;

	/* Must sum to 1 to avoid overall change in brightness.
	 * Scaling chosen so that pct=100 gives 1-D filter [-1 6 -1]/4,
	 * resulting in a 2-D filter [1 -6 1; -6 36 -6; 1 -6 1]/16,
	 * which gives noticeable, but not excessive, sharpening
	 */

	outer_coeff = -pct / 400.0;
	inner_coeff = 1 - 2 * outer_coeff;

	/* Don't try to do anything with non-truecolor images, as
	   pointless,
	   * nor for pct<=0, as small kernel size leads to nasty
	   artefacts when blurring
	 */
	if ((im->trueColor) && (pct > 0)) {

		/* First pass, 1-D convolution column-wise */
		for (x = 0; x < sx; x++) {

			/* pc is colour of previous pixel; c of the
			   current pixel and nc of the next */
			int pc, c, nc;

			/* Replicate edge pixel at image boundary */
			pc = gdImageGetPixel (im, x, 0);

			/* Stop looping before last pixel to avoid
			   conditional within loop */
			for (y = 0; y < sy - 1; y++) {

				c = gdImageGetPixel (im, x, y);

				nc = gdImageGetTrueColorPixel (im, x, y + 1);

				/* Update centre pixel to new colour */
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));

				/* Save original colour of current
				   pixel for next time round */
				pc = c;
			}

			/* Deal with last pixel, replicating current
			   pixel at image boundary */
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}

		/* Second pass, 1-D convolution row-wise */
		for (y = 0; y < sy; y++) {
			int pc, c;
			pc = gdImageGetPixel (im, 0, y);
			for (x = 0; x < sx - 1; x++) {
				int c, nc;
				c = gdImageGetPixel (im, x, y);
				nc = gdImageGetTrueColorPixel (im, x + 1, y);
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));
				pc = c;
			}
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}
	}
}